

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void bk_lib::detail::fill<Clasp::ShortImplicationsGraph::ImplicationList>
               (ImplicationList *first,ImplicationList *last,ImplicationList *x)

{
  ImplicationList *pIVar1;
  
  pIVar1 = first;
  switch((uint)((int)last - (int)first) >> 6 & 7) {
  case 0:
    while (pIVar1 != last) {
      first = pIVar1 + 1;
      Clasp::ShortImplicationsGraph::ImplicationList::ImplicationList(pIVar1,x);
switchD_0015cb55_caseD_7:
      pIVar1 = first + 1;
      Clasp::ShortImplicationsGraph::ImplicationList::ImplicationList(first,x);
switchD_0015cb55_caseD_6:
      first = pIVar1 + 1;
      Clasp::ShortImplicationsGraph::ImplicationList::ImplicationList(pIVar1,x);
switchD_0015cb55_caseD_5:
      pIVar1 = first + 1;
      Clasp::ShortImplicationsGraph::ImplicationList::ImplicationList(first,x);
switchD_0015cb55_caseD_4:
      first = pIVar1 + 1;
      Clasp::ShortImplicationsGraph::ImplicationList::ImplicationList(pIVar1,x);
switchD_0015cb55_caseD_3:
      pIVar1 = first + 1;
      Clasp::ShortImplicationsGraph::ImplicationList::ImplicationList(first,x);
switchD_0015cb55_caseD_2:
      first = pIVar1 + 1;
      Clasp::ShortImplicationsGraph::ImplicationList::ImplicationList(pIVar1,x);
switchD_0015cb55_caseD_1:
      Clasp::ShortImplicationsGraph::ImplicationList::ImplicationList(first,x);
      pIVar1 = first + 1;
    }
    break;
  case 1:
    goto switchD_0015cb55_caseD_1;
  case 2:
    goto switchD_0015cb55_caseD_2;
  case 3:
    goto switchD_0015cb55_caseD_3;
  case 4:
    goto switchD_0015cb55_caseD_4;
  case 5:
    goto switchD_0015cb55_caseD_5;
  case 6:
    goto switchD_0015cb55_caseD_6;
  case 7:
    goto switchD_0015cb55_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}